

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void api_wrapper_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  fdb_doc *doc;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  fdb_kvs_handle *pfVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  fdb_kvs_handle **ppfVar9;
  fdb_kvs_handle *handle;
  long lVar10;
  fdb_config *pfVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle;
  uint uVar14;
  char *unaff_RBP;
  fdb_encryption_key *pfVar15;
  fdb_doc *pfVar16;
  void **unaff_R12;
  ulong uVar17;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle;
  fdb_kvs_handle *pfVar18;
  fdb_doc **doc_00;
  char *pcVar19;
  fdb_kvs_handle **ppfVar20;
  char *pcVar21;
  bool bVar22;
  fdb_kvs_handle *db;
  void *value;
  size_t valuelen;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  char keybuf [256];
  char temp [256];
  fdb_config fconfig;
  char bodybuf [256];
  fdb_kvs_handle *pfStack_1c9c8;
  fdb_file_handle *pfStack_1c9c0;
  void *pvStack_1c9b8;
  size_t asStack_1c9b0 [3];
  undefined4 uStack_1c998;
  undefined4 uStack_1c994;
  undefined4 uStack_1c990;
  undefined4 uStack_1c98c;
  undefined4 uStack_1c988;
  fdb_kvs_config fStack_1c980;
  timeval tStack_1c968;
  fdb_config fStack_1c958;
  char acStack_1c860 [256];
  char acStack_1c760 [256];
  char acStack_1c660 [264];
  fdb_config *pfStack_1c558;
  fdb_kvs_handle **ppfStack_1c550;
  fdb_kvs_handle *pfStack_1c548;
  fdb_kvs_handle **ppfStack_1c540;
  fdb_kvs_handle *pfStack_1c538;
  code *pcStack_1c530;
  fdb_kvs_handle *pfStack_1c518;
  fdb_file_handle *pfStack_1c510;
  fdb_kvs_handle *pfStack_1c508;
  fdb_kvs_handle *pfStack_1c500;
  fdb_kvs_config fStack_1c4f8;
  timeval tStack_1c4e0;
  fdb_config fStack_1c4d0;
  fdb_kvs_handle *apfStack_1c3d8 [32];
  fdb_config fStack_1c2d8;
  fdb_kvs_handle **ppfStack_1c1d0;
  fdb_kvs_handle **ppfStack_1c1c8;
  fdb_kvs_handle **ppfStack_1c1c0;
  fdb_kvs_handle *pfStack_1c1b8;
  fdb_kvs_handle *pfStack_1c1a8;
  fdb_kvs_handle *pfStack_1c1a0;
  fdb_kvs_handle **ppfStack_1c198;
  fdb_kvs_handle *pfStack_1c190;
  fdb_kvs_config fStack_1c188;
  undefined1 auStack_1c170 [128];
  fdb_kvs_handle *apfStack_1c0f0 [33];
  fdb_config fStack_1bfe8;
  fdb_kvs_handle *apfStack_1bef0 [32];
  fdb_kvs_handle *apfStack_1bdf0 [32];
  fdb_kvs_handle fStack_1bcf0;
  undefined8 auStack_1b8f0 [896];
  fdb_kvs_handle *apfStack_19cf0 [1025];
  fdb_doc **ppfStack_17ce8;
  char *pcStack_17ce0;
  long lStack_17cd8;
  fdb_doc *pfStack_17cd0;
  fdb_doc **ppfStack_17cc8;
  fdb_doc *pfStack_17cc0;
  fdb_doc *pfStack_17ca8;
  fdb_file_handle *pfStack_17ca0;
  long lStack_17c98;
  fdb_kvs_handle *pfStack_17c90;
  long lStack_17c88;
  long lStack_17c80;
  fdb_doc **ppfStack_17c78;
  long lStack_17c70;
  fdb_doc **ppfStack_17c68;
  size_t sStack_17c60;
  timeval tStack_17c58;
  fdb_kvs_config fStack_17c48;
  fdb_file_info fStack_17c30;
  fdb_doc afStack_17be8 [3];
  char acStack_17ae8 [264];
  fdb_config fStack_179e0;
  char acStack_178e8 [256];
  fdb_doc *apfStack_177e8 [2999];
  size_t sStack_11a30;
  size_t asStack_11a28 [1023];
  undefined1 auStack_fa29 [57225];
  fdb_doc **ppfStack_1aa0;
  fdb_config *pfStack_1a98;
  fdb_file_handle **ppfStack_1a90;
  ulong uStack_1a88;
  fdb_kvs_handle **ppfStack_1a80;
  fdb_kvs_handle **ppfStack_1a78;
  fdb_doc *pfStack_1a60;
  fdb_kvs_handle *pfStack_1a58;
  undefined1 auStack_1a50 [24];
  fdb_file_handle *pfStack_1a38;
  fdb_kvs_handle *pfStack_1a30;
  fdb_kvs_config fStack_1a28;
  fdb_doc *apfStack_1a10 [31];
  timeval tStack_1918;
  fdb_config fStack_1908;
  char acStack_1810 [256];
  fdb_file_handle *apfStack_1710 [32];
  char acStack_1610 [264];
  fdb_kvs_handle **ppfStack_1508;
  char *pcStack_1500;
  char *pcStack_14f8;
  ulong uStack_14f0;
  undefined8 uStack_14e8;
  code *pcStack_14e0;
  fdb_file_handle *pfStack_14d8;
  fdb_kvs_handle *pfStack_14d0;
  char acStack_14c8 [32];
  fdb_kvs_config fStack_14a8;
  timeval tStack_1490;
  fdb_file_info afStack_1480 [3];
  fdb_config fStack_1388;
  fdb_config *pfStack_1290;
  fdb_kvs_handle **ppfStack_1288;
  fdb_kvs_handle *pfStack_1280;
  fdb_doc *pfStack_1278;
  fdb_kvs_handle *pfStack_1270;
  fdb_encryption_key *pfStack_1268;
  fdb_kvs_handle *pfStack_1258;
  fdb_file_handle *pfStack_1250;
  undefined1 auStack_1248 [8];
  undefined1 auStack_1240 [48];
  fdb_kvs_handle *apfStack_1210 [32];
  fdb_doc afStack_1110 [3];
  fdb_config fStack_1010;
  ulong uStack_f18;
  fdb_kvs_handle **ppfStack_f10;
  fdb_kvs_handle *pfStack_f08;
  fdb_doc *pfStack_f00;
  fdb_kvs_handle *pfStack_ef8;
  fdb_encryption_key *pfStack_ef0;
  fdb_doc *pfStack_ee0;
  fdb_kvs_handle *pfStack_ed8;
  fdb_kvs_handle *pfStack_ed0;
  fdb_file_handle *pfStack_ec8;
  fdb_file_handle *pfStack_ec0;
  fdb_doc *apfStack_eb8 [11];
  fdb_kvs_config fStack_e60;
  timeval tStack_e48;
  fdb_kvs_handle fStack_e38;
  fdb_config fStack_b38;
  fdb_kvs_config *pfStack_a40;
  fdb_file_handle **ppfStack_a38;
  fdb_file_handle **ppfStack_a30;
  fdb_kvs_handle **ppfStack_a28;
  char *pcStack_a20;
  code *pcStack_a18;
  fdb_file_handle *pfStack_a00;
  fdb_file_handle *pfStack_9f8;
  fdb_kvs_handle *pfStack_9f0;
  fdb_kvs_handle *pfStack_9e8;
  timeval tStack_9e0;
  fdb_doc *apfStack_9d0 [31];
  fdb_kvs_config fStack_8d8;
  char acStack_8c0 [264];
  fdb_config fStack_7b8;
  char acStack_6c0 [256];
  char acStack_5c0 [264];
  fdb_kvs_handle *pfStack_4b8;
  void **ppvStack_4b0;
  fdb_kvs_handle *pfStack_4a8;
  fdb_kvs_handle *pfStack_4a0;
  fdb_kvs_handle **ppfStack_498;
  code *pcStack_490;
  fdb_kvs_handle *local_480;
  fdb_kvs_handle *local_478;
  void *local_470;
  fdb_kvs_handle *local_468;
  timeval local_460;
  undefined1 local_450 [280];
  char local_338 [264];
  fdb_config local_230;
  void *local_138 [33];
  
  pcStack_490 = (code *)0x116ff2;
  gettimeofday(&local_460,(__timezone_ptr_t)0x0);
  pcStack_490 = (code *)0x116ff7;
  memleak_start();
  pcStack_490 = (code *)0x117003;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_490 = (code *)0x117013;
  fdb_get_default_config();
  pfVar18 = (fdb_kvs_handle *)local_450;
  pcStack_490 = (code *)0x117020;
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.purging_interval = 0;
  local_230.compaction_threshold = '\0';
  pcVar19 = (char *)&local_468;
  pcStack_490 = (code *)0x117059;
  fdb_open((fdb_file_handle **)pcVar19,"./dummy1",&local_230);
  pfVar5 = (fdb_kvs_handle *)&local_480;
  pcStack_490 = (code *)0x11706c;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_468,(fdb_kvs_handle **)pfVar5,(fdb_kvs_config *)pfVar18);
  pcStack_490 = (code *)0x117082;
  fVar3 = fdb_set_log_callback(local_480,logCallbackFunc,"api_wrapper_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172ea;
  pcStack_490 = (code *)0x11709d;
  fVar3 = fdb_set_kv(local_480,(void *)0x0,0,(void *)0x0,0);
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172ef;
  pcVar21 = local_450 + 0x18;
  pcVar19 = "body%d";
  unaff_R12 = local_138;
  unaff_RBP = (char *)0x0;
  do {
    pcStack_490 = (code *)0x1170cf;
    sprintf(pcVar21,"key%d",unaff_RBP);
    pcStack_490 = (code *)0x1170de;
    sprintf((char *)unaff_R12,"body%d",unaff_RBP);
    unaff_R13 = local_480;
    pcStack_490 = (code *)0x1170eb;
    pfVar5 = (fdb_kvs_handle *)strlen(pcVar21);
    pcStack_490 = (code *)0x1170f6;
    sVar6 = strlen((char *)unaff_R12);
    pcStack_490 = (code *)0x11710a;
    fVar3 = fdb_set_kv(unaff_R13,pcVar21,(size_t)pfVar5,unaff_R12,sVar6);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_490 = (code *)0x1172d0;
      api_wrapper_test();
      goto LAB_001172d0;
    }
    uVar14 = (int)unaff_RBP + 1;
    unaff_RBP = (char *)(ulong)uVar14;
  } while (uVar14 != 10);
  pfVar5 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x117134;
  sprintf((char *)pfVar5,"key%d",5);
  pfVar18 = local_480;
  pcStack_490 = (code *)0x117141;
  sVar6 = strlen((char *)pfVar5);
  pcStack_490 = (code *)0x11714f;
  fVar3 = fdb_del_kv(pfVar18,pfVar5,sVar6);
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172f4;
  pcStack_490 = (code *)0x117165;
  fVar3 = fdb_del_kv(local_480,(void *)0x0,0);
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172f9;
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcVar19 = (char *)&local_478;
  unaff_R12 = &local_470;
  unaff_RBP = local_338;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_490 = (code *)0x11719c;
    sprintf((char *)pfVar18,"key%d",unaff_R13);
    pfVar5 = local_480;
    pcStack_490 = (code *)0x1171a9;
    sVar6 = strlen((char *)pfVar18);
    pcStack_490 = (code *)0x1171bd;
    fVar3 = fdb_get_kv(pfVar5,pfVar18,sVar6,(void **)pcVar19,(size_t *)unaff_R12);
    if ((int)unaff_R13 == 5) {
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001172e5;
    }
    else {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172e0;
      pcStack_490 = (code *)0x1171e9;
      sprintf(unaff_RBP,"body%d",unaff_R13);
      pfVar5 = local_478;
      pcStack_490 = (code *)0x1171fe;
      iVar4 = bcmp(local_478,unaff_RBP,(size_t)local_470);
      if (iVar4 != 0) goto LAB_001172d0;
      pcStack_490 = (code *)0x11720e;
      fdb_free_block(pfVar5);
    }
    uVar14 = (int)unaff_R13 + 1;
    unaff_R13 = (fdb_kvs_handle *)(ulong)uVar14;
  } while (uVar14 != 10);
  pcStack_490 = (code *)0x117233;
  fVar3 = fdb_get_kv(local_480,(void *)0x0,0,&local_478,(size_t *)&local_470);
  handle = local_480;
  if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172fe;
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x11724e;
  sVar6 = strlen((char *)pfVar18);
  pcStack_490 = (code *)0x117261;
  fVar3 = fdb_get_kv(handle,pfVar18,sVar6,(void **)0x0,(size_t *)0x0);
  if (fVar3 == FDB_RESULT_INVALID_ARGS) {
    pcStack_490 = (code *)0x117274;
    fdb_kvs_close(local_480);
    pcStack_490 = (code *)0x11727e;
    fdb_close((fdb_file_handle *)local_468);
    pcStack_490 = (code *)0x117283;
    fdb_shutdown();
    pcStack_490 = (code *)0x117288;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (api_wrapper_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pcStack_490 = (code *)0x1172b9;
    fprintf(_stderr,pcVar19,"API wrapper test");
    return;
  }
  goto LAB_00117303;
LAB_00117e03:
  pfStack_ef0 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar13 = pfVar16;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_1268 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar18 = (fdb_kvs_handle *)pcVar19;
LAB_00118166:
  pcVar19 = (char *)pfVar18;
  pfStack_1268 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_1268 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar18 = (fdb_kvs_handle *)pcVar19;
LAB_00118178:
  pfVar16 = afStack_1110;
  ppfVar9 = apfStack_1210;
  pfStack_1268 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar5 = (fdb_kvs_handle *)pcVar21;
LAB_00119452:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_001172d0:
  pcStack_490 = (code *)0x1172e0;
  api_wrapper_test();
LAB_001172e0:
  pcStack_490 = (code *)0x1172e5;
  api_wrapper_test();
LAB_001172e5:
  pfVar18 = (fdb_kvs_handle *)(local_450 + 0x18);
  pcStack_490 = (code *)0x1172ea;
  api_wrapper_test();
LAB_001172ea:
  pcStack_490 = (code *)0x1172ef;
  api_wrapper_test();
LAB_001172ef:
  pcStack_490 = (code *)0x1172f4;
  api_wrapper_test();
LAB_001172f4:
  pcStack_490 = (code *)0x1172f9;
  api_wrapper_test();
LAB_001172f9:
  pcStack_490 = (code *)0x1172fe;
  api_wrapper_test();
LAB_001172fe:
  handle = pfVar5;
  pcStack_490 = (code *)0x117303;
  api_wrapper_test();
LAB_00117303:
  pcStack_490 = flush_before_commit_test;
  api_wrapper_test();
  pcStack_a18 = (code *)0x117325;
  pfStack_4b8 = handle;
  ppvStack_4b0 = unaff_R12;
  pfStack_4a8 = unaff_R13;
  pfStack_4a0 = pfVar18;
  ppfStack_498 = (fdb_kvs_handle **)pcVar19;
  pcStack_490 = (code *)unaff_RBP;
  gettimeofday(&tStack_9e0,(__timezone_ptr_t)0x0);
  pcStack_a18 = (code *)0x11732a;
  memleak_start();
  pcStack_a18 = (code *)0x117336;
  system("rm -rf  dummy* > errorlog.txt");
  pcStack_a18 = (code *)0x117346;
  fdb_get_default_config();
  pcStack_a18 = (code *)0x117356;
  fdb_get_default_kvs_config();
  fStack_7b8.buffercache_size = 0;
  fStack_7b8.wal_threshold = 5;
  fStack_7b8.flags = 1;
  fStack_7b8.purging_interval = 0;
  fStack_7b8.compaction_threshold = '\0';
  fStack_7b8.wal_flush_before_commit = true;
  pcStack_a18 = (code *)0x11739a;
  fdb_open(&pfStack_9f8,"dummy1",&fStack_7b8);
  pcStack_a18 = (code *)0x1173ad;
  fdb_open(&pfStack_a00,"dummy1",&fStack_7b8);
  pcStack_a18 = (code *)0x1173be;
  fdb_kvs_open_default(pfStack_9f8,&pfStack_9e8,&fStack_8d8);
  pcStack_a18 = (code *)0x1173d2;
  fdb_kvs_open_default(pfStack_a00,&pfStack_9f0,&fStack_8d8);
  pcStack_a18 = (code *)0x1173e8;
  fVar3 = fdb_set_log_callback(pfStack_9f0,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar12 = apfStack_9d0;
    uVar17 = 0;
    do {
      pcStack_a18 = (code *)0x117414;
      sprintf(acStack_8c0,"key%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x117430;
      sprintf(acStack_5c0,"meta%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x11744c;
      sprintf(acStack_6c0,"body%d",uVar17 & 0xffffffff);
      pcStack_a18 = (code *)0x117454;
      sVar6 = strlen(acStack_8c0);
      pcStack_a18 = (code *)0x11745f;
      sVar7 = strlen(acStack_5c0);
      pcStack_a18 = (code *)0x11746a;
      sVar8 = strlen(acStack_6c0);
      pcStack_a18 = (code *)0x11748a;
      fdb_doc_create(ppfVar12,acStack_8c0,sVar6,acStack_5c0,sVar7,acStack_6c0,sVar8);
      uVar17 = uVar17 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar17 != 0x1e);
    pcStack_a18 = (code *)0x1174aa;
    fdb_begin_transaction(pfStack_a00,'\x02');
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x1174bb;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x1174d2;
    fdb_commit(pfStack_9f8,'\0');
    do {
      pcStack_a18 = (code *)0x1174e1;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x1174f8;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x117507;
    fdb_commit(pfStack_9f8,'\x01');
    pcStack_a18 = (code *)0x117516;
    fdb_begin_transaction(pfStack_a00,'\x02');
    do {
      pcStack_a18 = (code *)0x117525;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x11753c;
    fdb_end_transaction(pfStack_a00,'\0');
    do {
      pcStack_a18 = (code *)0x11754b;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x117562;
    fdb_commit(pfStack_9f8,'\0');
    pcStack_a18 = (code *)0x117571;
    fdb_commit(pfStack_9f8,'\x01');
    pcStack_a18 = (code *)0x117580;
    fdb_begin_transaction(pfStack_a00,'\x02');
    do {
      pcStack_a18 = (code *)0x11758f;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x1175a9;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x1175c0;
    fdb_commit(pfStack_9f8,'\0');
    pcStack_a18 = (code *)0x1175cc;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x1175db;
    fdb_commit(pfStack_9f8,'\x01');
    pcStack_a18 = (code *)0x1175ea;
    fdb_begin_transaction(pfStack_a00,'\x02');
    do {
      pcStack_a18 = (code *)0x1175f9;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x117613;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 == 1);
    lVar10 = 0;
    pcStack_a18 = (code *)0x11762a;
    fdb_end_transaction(pfStack_a00,'\0');
    pcStack_a18 = (code *)0x117636;
    fdb_commit(pfStack_9f8,'\0');
    pcStack_a18 = (code *)0x117645;
    fdb_commit(pfStack_9f8,'\x01');
    pcStack_a18 = (code *)0x117654;
    fdb_begin_transaction(pfStack_a00,'\x02');
    do {
      pcStack_a18 = (code *)0x117663;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x117680;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10 + 10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 10);
    pcStack_a18 = (code *)0x11769a;
    fdb_compact(pfStack_9f8,"dummy2");
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x1176ae;
      fdb_set(pfStack_9f0,apfStack_9d0[lVar10 + 0x14]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    lVar10 = 0;
    pcStack_a18 = (code *)0x1176c5;
    fdb_end_transaction(pfStack_a00,'\0');
    do {
      pcStack_a18 = (code *)0x1176d7;
      fdb_set(pfStack_9e8,apfStack_9d0[lVar10 + 0x19]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 5);
    pcStack_a18 = (code *)0x1176ea;
    fdb_close(pfStack_9f8);
    pcStack_a18 = (code *)0x1176f4;
    fdb_close(pfStack_a00);
    lVar10 = 0;
    do {
      pcStack_a18 = (code *)0x117700;
      fdb_doc_free(apfStack_9d0[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x1e);
    pcStack_a18 = (code *)0x11770e;
    fdb_shutdown();
    pcStack_a18 = (code *)0x117713;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    pcStack_a18 = (code *)0x117744;
    fprintf(_stderr,pcVar19,"flush before commit test");
    return;
  }
  pcStack_a18 = flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_a20 = "dummy1";
  pfStack_ef0 = (fdb_encryption_key *)0x11777e;
  pfStack_a40 = &fStack_8d8;
  ppfStack_a38 = &pfStack_9f8;
  ppfStack_a30 = &pfStack_a00;
  ppfStack_a28 = &pfStack_9f0;
  pcStack_a18 = (code *)unaff_RBP;
  gettimeofday(&tStack_e48,(__timezone_ptr_t)0x0);
  pfStack_ef0 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_ee0 = (fdb_doc *)0x0;
  pfStack_ef0 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_ef0 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_b38.buffercache_size = 0;
  fStack_b38.wal_threshold = 8;
  fStack_b38.flags = 1;
  fStack_b38.purging_interval = 0;
  fStack_b38.compaction_threshold = '\0';
  fStack_b38.wal_flush_before_commit = true;
  pfStack_ef0 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_ef0 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_ec8,"dummy1",&fStack_b38);
  pfStack_ef0 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_ec8,&pfStack_ed8,(char *)0x0,&fStack_e60);
  lVar10 = 0;
  uVar17 = 0;
  do {
    ppfVar9 = &fStack_e38.bub_ctx.handle;
    pfStack_ef0 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar9,"key%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_e38.config.encryption_key,"meta%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_e38,"body%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x11785f;
    sVar6 = strlen((char *)ppfVar9);
    pfVar15 = &fStack_e38.config.encryption_key;
    pfStack_ef0 = (fdb_encryption_key *)0x117872;
    sVar7 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x117882;
    sVar8 = strlen((char *)&fStack_e38);
    pfStack_ef0 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_eb8 + lVar10),&fStack_e38.bub_ctx.handle,sVar6,
                   pfVar15,sVar7,&fStack_e38,sVar8);
    pfStack_ef0 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_ed8,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 10);
  pfStack_ef0 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_ec8,'\x01');
  pfStack_ef0 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_ec0,"dummy1",&fStack_b38);
  pfStack_ef0 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_ec0,&pfStack_ed0,(char *)0x0,&fStack_e60);
  pfVar15 = &fStack_e38.config.encryption_key;
  lVar10 = 0;
  uVar17 = 0;
  do {
    pfStack_ef0 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar15,"meta2%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_e38,"body2%d(db2)",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x117956;
    sVar6 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x117961;
    sVar7 = strlen((char *)&fStack_e38);
    pfStack_ef0 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_eb8 + lVar10),pfVar15,sVar6,&fStack_e38,sVar7);
    pfStack_ef0 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_ed0,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 5);
  uVar17 = 5;
  lVar10 = 0x28;
  pfVar15 = &fStack_e38.config.encryption_key;
  pfVar5 = &fStack_e38;
  do {
    pfStack_ef0 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar15,"meta2%d",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar5,"body2%d(db1)",uVar17 & 0xffffffff);
    pfStack_ef0 = (fdb_encryption_key *)0x1179e5;
    sVar6 = strlen((char *)pfVar15);
    pfStack_ef0 = (fdb_encryption_key *)0x1179f0;
    sVar7 = strlen((char *)pfVar5);
    pfStack_ef0 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_eb8 + lVar10),pfVar15,sVar6,pfVar5,sVar7);
    pfStack_ef0 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_ed8,apfStack_eb8[uVar17]);
    uVar17 = uVar17 + 1;
    lVar10 = lVar10 + 8;
  } while (uVar17 != 10);
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  uVar17 = 0;
  do {
    pcVar19 = "body2%d(db1)";
    pfStack_ef0 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar9,"key%d",uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar15,"meta2%d",uVar17);
    if ((uint)uVar17 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_ef0 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_e38,pcVar19,uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117a8c;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(pfStack_ed8,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_ef0 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_ef0 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar16 = (fdb_doc *)pcVar19;
LAB_00117dd3:
      pfStack_ef0 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_ef0 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_ef0 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) {
      pfStack_ef0 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar19 = (char *)pfVar16;
      goto LAB_00117dc9;
    }
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_ef0 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar16);
    pcVar19 = (char *)0x0;
    pfStack_ee0 = (fdb_doc *)0x0;
    pfStack_ef0 = (fdb_encryption_key *)0x117b16;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(pfStack_ed0,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_ef0 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar16);
    pfStack_ee0 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar17 + 1;
    uVar17 = (ulong)uVar14;
  } while (uVar14 != 10);
  pfStack_ef0 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_ec8,'\0');
  pfStack_ef0 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_ec0,'\0');
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  uVar17 = 0;
  while( true ) {
    pfStack_ef0 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar9,"key%d",uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar15,"meta2%d",uVar17);
    pcVar19 = "body2%d(db1)";
    if ((uint)uVar17 < 5) {
      pcVar19 = "body2%d(db2)";
    }
    pfStack_ef0 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_e38,pcVar19,uVar17);
    pfStack_ef0 = (fdb_encryption_key *)0x117c28;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(pfStack_ed8,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    pfVar13 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_ef0 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar16);
    pfVar13 = (fdb_doc *)0x0;
    pfStack_ee0 = (fdb_doc *)0x0;
    pfStack_ef0 = (fdb_encryption_key *)0x117cb2;
    sVar6 = strlen((char *)ppfVar9);
    pfStack_ef0 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_ee0,ppfVar9,sVar6,(void *)0x0,0,(void *)0x0,0);
    pfStack_ef0 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(pfStack_ed0,pfStack_ee0);
    pfVar16 = pfStack_ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar5 = (fdb_kvs_handle *)pfStack_ee0->meta;
    pfStack_ef0 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar15,pfVar5,pfStack_ee0->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar5 = (fdb_kvs_handle *)pfVar16->body;
    pfStack_ef0 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&fStack_e38,pfVar5,pfVar16->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_ef0 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar16);
    pfStack_ee0 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar17 + 1;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 10) {
      pfStack_ef0 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_ec8);
      pfStack_ef0 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_ec0);
      lVar10 = 0;
      do {
        pfStack_ef0 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_eb8[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 10);
      pfStack_ef0 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_ef0 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_ef0 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar19,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_ef0 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_ef0 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar16 = pfVar13;
LAB_00117e1d:
  pfStack_ef0 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_ef0 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar18 = &fStack_e38;
  ppfVar9 = &fStack_e38.bub_ctx.handle;
  pfVar15 = &fStack_e38.config.encryption_key;
  pfStack_ef0 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_1268 = (fdb_encryption_key *)0x117e6a;
  uStack_f18 = uVar17;
  ppfStack_f10 = ppfVar9;
  pfStack_f08 = pfVar5;
  pfStack_f00 = pfVar16;
  pfStack_ef8 = pfVar18;
  pfStack_ef0 = pfVar15;
  gettimeofday((timeval *)(auStack_1240 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_1268 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_1268 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1010;
  pfStack_1268 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_1268 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_1010.buffercache_size = 0;
  fStack_1010.wal_threshold = 0x1000;
  fStack_1010.flags = 1;
  fStack_1010.durability_opt = '\x02';
  fStack_1010.auto_commit = true;
  pfStack_1268 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_1250,"dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_1268 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_1250,&pfStack_1258,(fdb_kvs_config *)(auStack_1240 + 8));
    pcVar19 = (char *)pfVar18;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar19 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_1110,"key%d",pfVar15);
      pfStack_1268 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_1210,"body%d",pfVar15);
      pfVar5 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x117f31;
      sVar6 = strlen((char *)afStack_1110);
      pfVar11 = (fdb_config *)(sVar6 + 1);
      pfStack_1268 = (fdb_encryption_key *)0x117f3d;
      sVar6 = strlen((char *)apfStack_1210);
      pfStack_1268 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar5,afStack_1110,(size_t)pfVar11,apfStack_1210,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1268 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfVar16 = afStack_1110;
    ppfVar9 = apfStack_1210;
    pfVar5 = (fdb_kvs_handle *)auStack_1240;
    pfVar15 = (fdb_encryption_key *)auStack_1248;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar16,"key%d",pfVar11);
      pfStack_1268 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar9,"body%d",pfVar11);
      pfVar18 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x117fb0;
      sVar6 = strlen((char *)pfVar16);
      pfStack_1268 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar18,pfVar16,sVar6 + 1,(void **)pfVar5,(size_t *)pfVar15);
      pcVar19 = (char *)auStack_1240._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_1268 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_1240._0_8_,ppfVar9,(size_t)auStack_1248);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_1268 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1268 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_1258);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_1268 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_1250);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_1268 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_1250,"dummy1",&fStack_1010);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_1268 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_1250,&pfStack_1258,(fdb_kvs_config *)(auStack_1240 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar16 = afStack_1110;
    ppfVar9 = apfStack_1210;
    pfVar5 = (fdb_kvs_handle *)auStack_1240;
    pfVar15 = (fdb_encryption_key *)auStack_1248;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_1268 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar16,"key%d",pfVar11);
      pfStack_1268 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar9,"body%d",pfVar11);
      pfVar18 = pfStack_1258;
      pfStack_1268 = (fdb_encryption_key *)0x1180a9;
      sVar6 = strlen((char *)pfVar16);
      pfStack_1268 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar18,pfVar16,sVar6 + 1,(void **)pfVar5,(size_t *)pfVar15);
      pcVar19 = (char *)auStack_1240._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_1268 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_1240._0_8_,ppfVar9,(size_t)auStack_1248);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_1268 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar19);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_1268 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_1250);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_1268 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_1268 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1268 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar19,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_1268 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar19 = (char *)pfVar18;
LAB_00118182:
    pfStack_1268 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_1268 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_1268 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_1268 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_1268 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_1268 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_14e0 = (code *)0x1181bd;
  pfStack_1290 = pfVar11;
  ppfStack_1288 = ppfVar9;
  pfStack_1280 = pfVar5;
  pfStack_1278 = pfVar16;
  pfStack_1270 = (fdb_kvs_handle *)pcVar19;
  pfStack_1268 = pfVar15;
  gettimeofday(&tStack_1490,(__timezone_ptr_t)0x0);
  pcStack_14e0 = (code *)0x1181c2;
  memleak_start();
  pcStack_14e0 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_14e0 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_1388.buffercache_size = 0;
  fStack_1388.auto_commit = true;
  pcStack_14e0 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_14e0 = (code *)0x118207;
  memcpy(&fStack_1388,afStack_1480,0xf8);
  pcStack_14e0 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar17 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_14c8 + 8,"est1",5);
    builtin_strncpy(acStack_14c8,"./func_t",8);
    pcStack_14e0 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_14d8,acStack_14c8,&fStack_1388);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_14e0 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_14d8,&pfStack_14d0,"justonekv",&fStack_14a8);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_14e0 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_14e0 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_14d8,afStack_1480);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_1480[0].file_size != fStack_1388.blocksize * 7) {
      pcStack_14e0 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_14e0 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_14d8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar14 = (int)uVar17 + 1;
    uVar17 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_14e0 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_14e0 = (code *)0x1182e9;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_14e0 = (code *)0x11831a;
      fprintf(_stderr,pcVar19,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_14e0 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_14e0 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_14e0 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_14e8 = 0x745f636e75662f2e;
  pcStack_14f8 = "justonekv";
  ppfStack_1a78 = (fdb_kvs_handle **)0x118363;
  ppfStack_1508 = &pfStack_14d0;
  pcStack_1500 = acStack_14c8;
  uStack_14f0 = uVar17;
  pcStack_14e0 = (code *)&pfStack_14d8;
  gettimeofday(&tStack_1918,(__timezone_ptr_t)0x0);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_1a60 = (fdb_doc *)0x0;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_1a78 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_1a78 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_1908.buffercache_size = 0;
  fStack_1908.flags = 1;
  fStack_1908.purging_interval = 0;
  fStack_1908.compaction_threshold = '\0';
  ppfStack_1a78 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  ppfVar12 = apfStack_1a10;
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_1810,"key%d",uVar17 & 0xffffffff);
    ppfStack_1a78 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_1610,"meta%d",uVar17 & 0xffffffff);
    ptr_fhandle = apfStack_1710;
    ppfStack_1a78 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle,"body%d",uVar17 & 0xffffffff);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118462;
    ppfVar9 = (fdb_kvs_handle **)strlen(acStack_1810);
    ppfStack_1a78 = (fdb_kvs_handle **)0x11846d;
    sVar6 = strlen(acStack_1610);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118478;
    sVar7 = strlen((char *)ptr_fhandle);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar12,acStack_1810,(size_t)ppfVar9,acStack_1610,sVar6,ptr_fhandle,sVar7);
    uVar17 = uVar17 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar17 != 0x1e);
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_1a58,apfStack_1a10[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 == 1);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_1908;
  ppfStack_1a78 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if (uVar17 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_1a78 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 4);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 2]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_1a58,apfStack_1a10[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfVar20 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_1908;
  ppfStack_1a78 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",pfVar11);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
             &fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if ((uVar17 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_1a78 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_1a78 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 6);
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_1a58,apfStack_1a10[lVar10 + 4]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[lVar10 + 6]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_1a38,"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_1a38,&pfStack_1a30,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_1a38,'\x02');
  lVar10 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_1a30,apfStack_1a10[lVar10 + 8]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 2);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_1a38,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_1a38);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,&pfStack_1a58,&fStack_1a28);
  uVar17 = 0;
  do {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17]->key,apfStack_1a10[uVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if ((int)uVar17 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_1a78 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
  } while (uVar17 != 10);
  pfVar11 = (fdb_config *)auStack_1a50;
  ppfStack_1a78 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar11,"dummy1",&fStack_1908);
  ptr_fhandle = &pfStack_1a38;
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle,"dummy1",&fStack_1908);
  ppfVar20 = (fdb_kvs_handle **)(auStack_1a50 + 8);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._0_8_,ppfVar20,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_1a38,&pfStack_1a30,&fStack_1a28);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
  ppfVar9 = &pfStack_1a58;
  ppfStack_1a78 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_1a58,apfStack_1a10[10]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_1a58,apfStack_1a10[0xb]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0xc]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0xd]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_1a38,'\x02');
  ppfStack_1a78 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_1a30,apfStack_1a10[0xe]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_1a30,apfStack_1a10[0xf]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_1a58,apfStack_1a10[0x10]);
  ppfStack_1a78 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_1a38,'\x01');
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_1a58,apfStack_1a10[0x11]);
  uVar17 = 0;
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_1a50._16_8_,'\0');
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_1a38);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_1a50 + 0x10),"dummy1",&fStack_1908);
  ppfStack_1a78 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1a50._16_8_,ppfVar9,&fStack_1a28);
  while( true ) {
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_1a60,apfStack_1a10[uVar17 + 10]->key,apfStack_1a10[uVar17 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_1a58,pfStack_1a60);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_1a78 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_1a60);
    pfStack_1a60 = (fdb_doc *)0x0;
    uVar17 = uVar17 + 1;
    if (uVar17 == 8) {
      ppfStack_1a78 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_1a50,"dummy1",&fStack_1908);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_1a50._0_8_,(fdb_kvs_handle **)(auStack_1a50 + 8),
                 &fStack_1a28);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x02');
      ppfStack_1a78 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_1a50._8_8_,apfStack_1a10[0x14]);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_1a50._16_8_,"dummy2");
      ppfStack_1a78 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_1a50._0_8_,'\x01');
      ppfStack_1a78 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_1a50._16_8_);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_1a50._0_8_);
      lVar10 = 0;
      do {
        ppfStack_1a78 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_1a10[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 0x1e);
      ppfStack_1a78 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_1a78 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      ppfStack_1a78 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar19,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_1a78 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_1a78 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_17cc0 = (fdb_doc *)0x118b77;
  ppfStack_1aa0 = &pfStack_1a60;
  pfStack_1a98 = pfVar11;
  ppfStack_1a90 = ptr_fhandle;
  uStack_1a88 = uVar17;
  ppfStack_1a80 = ppfVar20;
  ppfStack_1a78 = ppfVar9;
  gettimeofday(&tStack_17c58,(__timezone_ptr_t)0x0);
  pfStack_17cc0 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_17ca8 = (fdb_doc *)0x0;
  pfStack_17cc0 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_17cc0 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_17cc0 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_179e0.flags = 1;
  fStack_179e0.purging_interval = 0;
  fStack_179e0.compaction_threshold = '\0';
  fStack_179e0.durability_opt = '\x02';
  pfStack_17cc0 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_17ca0,"dummy1",&fStack_179e0);
  pfStack_17cc0 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_17ca0,&pfStack_17c90,&fStack_17c48);
  ppfVar12 = apfStack_177e8;
  pfVar16 = afStack_17be8;
  pfVar13 = (fdb_doc *)0x0;
  lVar10 = 0;
  do {
    sVar6 = 0xff7f;
    if (lVar10 == 1) {
      sVar6 = 0x1fff;
    }
    if (lVar10 == 0) {
      sVar6 = 0x7fff;
    }
    pfStack_17cc0 = (fdb_doc *)0x118c39;
    lStack_17c88 = lVar10;
    memset(asStack_11a28,0x5f,sVar6);
    *(undefined1 *)((long)asStack_11a28 + sVar6) = 0;
    lVar10 = 0;
    doc_00 = ppfVar12;
    lStack_17c80 = (long)pfVar13;
    ppfStack_17c78 = ppfVar12;
    sStack_17c60 = sVar6;
    do {
      pfStack_17cc0 = (fdb_doc *)0x118c6f;
      lStack_17c70 = lVar10;
      sprintf((char *)pfVar16,"%08d");
      asStack_11a28[0] = afStack_17be8[0].keylen;
      uVar17 = 0;
      lStack_17c98 = (long)pfVar13;
      ppfStack_17c68 = doc_00;
      do {
        pfStack_17cc0 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar16,"%08d",uVar17 & 0xffffffff);
        *(size_t *)((long)apfStack_177e8 + sStack_17c60 + 0x5db8) = afStack_17be8[0].keylen;
        uVar14 = (int)lStack_17c98 + (int)uVar17;
        pfStack_17cc0 = (fdb_doc *)0x118ce4;
        sprintf(acStack_178e8,"meta%d",(ulong)uVar14);
        pfStack_17cc0 = (fdb_doc *)0x118cf7;
        sprintf(acStack_17ae8,"body%d",(ulong)uVar14);
        pfStack_17cc0 = (fdb_doc *)0x118d04;
        sVar6 = strlen((char *)asStack_11a28);
        pfStack_17cc0 = (fdb_doc *)0x118d10;
        sVar7 = strlen(acStack_178e8);
        pfStack_17cc0 = (fdb_doc *)0x118d24;
        sVar8 = strlen(acStack_17ae8);
        lVar1 = lStack_17c98;
        pcVar19 = acStack_17ae8;
        pfStack_17cc0 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_11a28,sVar6 + 1,acStack_178e8,sVar7 + 1,pcVar19,sVar8 + 1);
        uVar17 = uVar17 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar17 != 10);
      lVar10 = lStack_17c70 + 1;
      doc_00 = ppfStack_17c68 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar10 != 100);
    lVar10 = lStack_17c88 + 1;
    ppfVar12 = ppfStack_17c78 + 1000;
    pfVar13 = (fdb_doc *)(lStack_17c80 + 1000);
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    pfStack_17cc0 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_17c90,apfStack_177e8[lVar10]);
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3000);
  pfStack_17cc0 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_17ca0,'\x01');
  pfStack_17cc0 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_17ca0,&fStack_17c30);
  if (fStack_17c30.doc_count != 3000) {
    pfStack_17cc0 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar10 = 0;
  while( true ) {
    pfStack_17cc0 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_17ca8,apfStack_177e8[lVar10]->key,apfStack_177e8[lVar10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_17cc0 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_17c90,pfStack_17ca8);
    doc = pfStack_17ca8;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_17ca8->key;
    pfVar16 = apfStack_177e8[lVar10];
    pcVar19 = (char *)pfVar16->key;
    pfStack_17cc0 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar19,pfStack_17ca8->keylen);
    pfVar13 = doc;
    if (iVar4 != 0) {
      pfStack_17cc0 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)doc->meta;
    pcVar19 = (char *)pfVar16->meta;
    pfStack_17cc0 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar19,doc->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)doc->body;
    pcVar19 = (char *)pfVar16->body;
    pfStack_17cc0 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar19,doc->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_17cc0 = (fdb_doc *)0x118ecb;
    fdb_doc_free(doc);
    pfStack_17ca8 = (fdb_doc *)0x0;
    lVar10 = lVar10 + 1;
    if (lVar10 == 3000) {
      pfStack_17cc0 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_17ca0);
      lVar10 = 0;
      do {
        pfStack_17cc0 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_177e8[lVar10]);
        lVar10 = lVar10 + 1;
      } while (lVar10 != 3000);
      pfStack_17cc0 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_17cc0 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_17cc0 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar19,"long key test");
      return;
    }
  }
  pfStack_17cc0 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_17cc0 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_17cc0 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_17ce8 = &pfStack_17ca8;
  pcStack_17ce0 = pcVar19;
  lStack_17cd8 = lVar10;
  pfStack_17cd0 = pfVar13;
  ppfStack_17cc8 = doc_00;
  pfStack_17cc0 = pfVar16;
  gettimeofday((timeval *)(auStack_1c170 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1c1b8 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1c1b8 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1bfe8.wal_threshold = 0x400;
  fStack_1bfe8.compaction_mode = '\0';
  fStack_1bfe8.durability_opt = '\x02';
  pcVar21 = (char *)&fStack_1bcf0;
  ppfVar20 = apfStack_1bef0;
  pcVar19 = "kvs%d";
  uVar17 = 0;
  ppfVar9 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar20,"dummy%d",(ulong)ppfVar9 & 0xffffffff);
    ptr_handle = (char *)(apfStack_1c0f0 + (long)ppfVar9 + -10);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle,(char *)ppfVar20,&fStack_1bfe8);
    pfVar5 = (fdb_kvs_handle *)pcVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1c198 = ppfVar9;
    pfStack_1c190 = (fdb_kvs_handle *)pcVar21;
    do {
      ppfVar9 = ppfVar2;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar20,"kvs%d",(ulong)(uint)((int)ppfVar9 + (int)uVar17));
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle,
                           (fdb_kvs_handle **)pcVar21,(char *)ppfVar20,&fStack_1c188);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1c1b8 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      pcVar21 = (char *)&(((fdb_kvs_handle *)pcVar21)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar9 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar9 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar9 = (fdb_kvs_handle **)((long)ppfStack_1c198 + 1);
    uVar17 = uVar17 + 0x80;
    pcVar21 = (char *)&pfStack_1c190[1].bub_ctx.space_used;
  } while (ppfVar9 != (fdb_kvs_handle **)0x8);
  ppfVar9 = apfStack_1c0f0;
  ppfVar20 = apfStack_1bdf0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar9,"key%08d",uVar17);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar20,"value%08d",uVar17);
      pcVar19 = *(char **)(&fStack_1bcf0.kvs_config.create_if_missing + (long)pfVar5 * 8);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1190e0;
      sVar6 = strlen((char *)ppfVar9);
      ptr_handle = (char *)(sVar6 + 1);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1190ec;
      sVar6 = strlen((char *)ppfVar20);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar19,ppfVar9,(size_t)ptr_handle,ppfVar20,sVar6 + 1);
      pcVar21 = (char *)pfVar5;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x400);
  ptr_handle = (char *)0x0;
  do {
    if (((ulong)ptr_handle & 1) == 0) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c0f0[(long)ptr_handle + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1c0f0[(long)ptr_handle + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ppfVar20 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle = (char *)apfStack_19cf0;
  ppfVar9 = (fdb_kvs_handle **)(auStack_1c170 + 8);
  pfVar5 = (fdb_kvs_handle *)auStack_1c170;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1b8f0[(long)ppfVar20],(fdb_kvs_info *)pfVar5);
    if ((fdb_custom_cmp_variable)auStack_1c170._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1b8f0[(long)ppfVar20],
                              (fdb_kvs_handle **)ptr_handle,auStack_1c170._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar20 = ppfVar20 + 0x10;
    ptr_handle = (char *)((long)ptr_handle + 0x400);
  } while (ppfVar20 < (fdb_kvs_handle **)0x380);
  ptr_handle = (char *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1c0f0[(long)ptr_handle - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle = (char *)((long)ptr_handle + 1);
  } while ((fdb_kvs_handle **)ptr_handle != (fdb_kvs_handle **)0x8);
  ptr_handle = (char *)&pfStack_1c1a0;
  pfStack_1c1a0 = (fdb_kvs_handle *)0x0;
  ppfVar9 = &pfStack_1c1a8;
  pcVar21 = "key%08d";
  ppfVar20 = apfStack_1c0f0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_19cf0[(long)pfVar5],(fdb_iterator **)ppfVar9,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1c1a8,(fdb_doc **)ptr_handle);
      pcVar19 = (char *)pfVar5;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar20,"key%08d",uVar17);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar20,(char *)pfStack_1c1a0->op_stats);
      if (iVar4 != 0) {
        pfStack_1c1b8 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1c1a8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1c1a8);
    pcVar19 = (char *)&(pfVar5->config).wal_threshold;
    bVar22 = pfVar5 < (fdb_kvs_handle *)0x380;
    pfVar5 = (fdb_kvs_handle *)pcVar19;
  } while (bVar22);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1c1a0);
  ptr_handle = "key%08d";
  ppfVar9 = apfStack_1c0f0;
  ppfVar20 = (fdb_kvs_handle **)0x0;
  do {
    uVar17 = 0;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar9,"key%08d",uVar17);
      pcVar21 = *(char **)(&fStack_1bcf0.kvs_config.create_if_missing + (long)ppfVar20 * 8);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1192dd;
      sVar6 = strlen((char *)ppfVar9);
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar21,ppfVar9,sVar6 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar20 = (fdb_kvs_handle **)((long)ppfVar20 + 1);
  } while (ppfVar20 != (fdb_kvs_handle **)0x400);
  ptr_handle = "dummy_compact%d";
  ppfVar9 = apfStack_1bef0;
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar9,"dummy_compact%d",(ulong)pfVar5 & 0xffffffff);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1c0f0[(long)((long)&pfVar5[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar9);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar5 = (fdb_kvs_handle *)&(pfVar5->kvs_config).field_0x1;
  } while (pfVar5 != (fdb_kvs_handle *)0x8);
  ptr_handle = (char *)&pfStack_1c1a0;
  pfStack_1c1a0 = (fdb_kvs_handle *)0x0;
  ppfVar9 = &pfStack_1c1a8;
  pcVar21 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1bcf0.kvs_config.create_if_missing + (long)pcVar21 * 8),
                              (fdb_iterator **)ppfVar9,(void *)0x0,0,(void *)0x0,0,2);
    pfVar5 = (fdb_kvs_handle *)pcVar21;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1c1a8,(fdb_doc **)ptr_handle);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1c1a8);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1c1a8);
    pfVar5 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar21)->config).wal_threshold;
    bVar22 = pcVar21 < (fdb_kvs_handle *)0x380;
    pcVar21 = (char *)pfVar5;
  } while (bVar22);
  pfStack_1c1b8 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1c1a0);
  ptr_handle = (char *)0x0;
  while( true ) {
    pfStack_1c1b8 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1c0f0[(long)ptr_handle - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle = (char *)((long)ptr_handle + 1);
    if ((fdb_kvs_handle **)ptr_handle == (fdb_kvs_handle **)0x8) {
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1c1b8 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_1c1b8 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar19,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1c1b8 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1c1b8 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1c530 = (code *)0x119494;
  ppfStack_1c1d0 = (fdb_kvs_handle **)ptr_handle;
  ppfStack_1c1c8 = ppfVar20;
  ppfStack_1c1c0 = ppfVar9;
  pfStack_1c1b8 = pfVar5;
  gettimeofday(&tStack_1c4e0,(__timezone_ptr_t)0x0);
  pcStack_1c530 = (code *)0x119499;
  memleak_start();
  pcStack_1c530 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1c4d0;
  pcStack_1c530 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1c530 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1c530 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1c510,"./dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1c530 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1c510,&pfStack_1c508,"db",&fStack_1c4f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1c530 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1c510,&pfStack_1c500,"db2",&fStack_1c4f8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar11 = &fStack_1c2d8;
    pcStack_1c530 = (code *)0x119539;
    sprintf((char *)pfVar11,"key%d",0);
    ppfVar9 = apfStack_1c3d8;
    pcStack_1c530 = (code *)0x119554;
    sprintf((char *)ppfVar9,"body%d",0);
    pcStack_1c530 = (code *)0x11955c;
    pfVar5 = (fdb_kvs_handle *)strlen((char *)pfVar11);
    pcStack_1c530 = (code *)0x119567;
    sVar6 = strlen((char *)ppfVar9);
    ppfVar20 = &pfStack_1c518;
    pcStack_1c530 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar20,pfVar11,(size_t)pfVar5,(void *)0x0,0,ppfVar9,sVar6 + 1);
    pcStack_1c530 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1c530 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1c510,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1c530 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1c518->field_6).seqtree,"bOdy%d",0);
    pcStack_1c530 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1c500,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1c530 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1c510,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1c530 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1c530 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1c500,(fdb_doc *)pfStack_1c518);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1c530 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1c508,(fdb_doc *)pfStack_1c518);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1c530 = (code *)0x11964d;
      fdb_close(pfStack_1c510);
      pcStack_1c530 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1c518);
      pcStack_1c530 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1c530 = (code *)0x119661;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_1c530 = (code *)0x119692;
      fprintf(_stderr,pcVar19,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1c530 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1c530 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1c530 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1c530 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1c530 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1c530 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1c530 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1c530 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1c530 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1c530 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1c558 = pfVar11;
  ppfStack_1c550 = ppfVar20;
  pfStack_1c548 = (fdb_kvs_handle *)pcVar19;
  ppfStack_1c540 = ppfVar9;
  pfStack_1c538 = pfVar5;
  pcStack_1c530 = (code *)uVar17;
  gettimeofday(&tStack_1c968,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1c958.wal_threshold = 0x400;
  fStack_1c958.flags = 1;
  fStack_1c958.purging_interval = 0;
  fStack_1c958.compaction_threshold = '\0';
  fStack_1c958.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1c958.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1c9c0,"./dummy1",&fStack_1c958);
  fdb_kvs_open_default(pfStack_1c9c0,&pfStack_1c9c8,&fStack_1c980);
  fVar3 = fdb_set_log_callback(pfStack_1c9c8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1c9c8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar17 = 0;
    do {
      sprintf(acStack_1c760,"key%d",uVar17);
      sprintf(acStack_1c660,"body%d",uVar17);
      pfVar5 = pfStack_1c9c8;
      sVar6 = strlen(acStack_1c760);
      sVar7 = strlen(acStack_1c660);
      fVar3 = fdb_set_kv(pfVar5,acStack_1c760,sVar6,acStack_1c660,sVar7);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar14 = (int)uVar17 + 1;
      uVar17 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1c9b0[1] = 0x726162ffffffff;
    asStack_1c9b0[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1c998 = 0xbdbdbdbd;
    uStack_1c994 = 0xbdbdbdbd;
    uStack_1c990 = 0xbdbdbdbd;
    uStack_1c98c = 0xbdbdbdbd;
    uStack_1c988 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1c9c0,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1c9c8);
    fdb_close(pfStack_1c9c0);
    fStack_1c958.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1c958.encryption_key.bytes,"bar",4);
    fStack_1c958.encryption_key.bytes[4] = 0xbd;
    fStack_1c958.encryption_key.bytes[5] = 0xbd;
    fStack_1c958.encryption_key.bytes[6] = 0xbd;
    fStack_1c958.encryption_key.bytes[7] = 0xbd;
    fStack_1c958.encryption_key.bytes[8] = 0xbd;
    fStack_1c958.encryption_key.bytes[9] = 0xbd;
    fStack_1c958.encryption_key.bytes[10] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xb] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xc] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xd] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xe] = 0xbd;
    fStack_1c958.encryption_key.bytes[0xf] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x10] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x11] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x12] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x13] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x14] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x15] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x16] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x17] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x18] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x19] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1c958.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1c9c0,"./dummy1",&fStack_1c958);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1c9c0,&pfStack_1c9c8,&fStack_1c980);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1c9c8,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar17 = 0;
      while( true ) {
        sprintf(acStack_1c760,"key%d",uVar17);
        pfVar5 = pfStack_1c9c8;
        sVar6 = strlen(acStack_1c760);
        fVar3 = fdb_get_kv(pfVar5,acStack_1c760,sVar6,&pvStack_1c9b8,asStack_1c9b0);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1c860,"body%d",uVar17);
        ptr = pvStack_1c9b8;
        iVar4 = bcmp(pvStack_1c9b8,acStack_1c860,asStack_1c9b0[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar14 = (int)uVar17 + 1;
        uVar17 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1c9c8);
          fdb_close(pfStack_1c9c0);
          fdb_shutdown();
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar19,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void api_wrapper_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    size_t valuelen;
    void *value;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status status;

    char keybuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "api_wrapper_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_set_kv(db, NULL, 0, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // insert key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(bodybuf, "body%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // remove key5
    sprintf(keybuf, "key%d", 5);
    status = fdb_del_kv(db, keybuf, strlen(keybuf));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // error check
    status = fdb_del_kv(db, NULL, 0);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // retrieve key-value pairs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(temp, "body%d", i);
            TEST_CMP(value, temp, valuelen);
            fdb_free_block(value);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }
    }

    // error check
    status = fdb_get_kv(db, NULL, 0, &value, &valuelen);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    status = fdb_get_kv(db, keybuf, strlen(keybuf), NULL, NULL);
    TEST_CHK(status == FDB_RESULT_INVALID_ARGS);

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("API wrapper test");
}